

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O0

bool __thiscall fp::Algorithm::IsExplored(Algorithm *this,array<int,_2UL> cur_node)

{
  reference pvVar1;
  reference this_00;
  reference pvVar2;
  Algorithm *this_local;
  array<int,_2UL> cur_node_local;
  
  this_local = (Algorithm *)cur_node._M_elems;
  pvVar1 = std::array<int,_2UL>::at((array<int,_2UL> *)&this_local,0);
  this_00 = std::array<std::array<bool,_16UL>,_16UL>::at(&this->explored_node_,(long)*pvVar1);
  pvVar1 = std::array<int,_2UL>::at((array<int,_2UL> *)&this_local,1);
  pvVar2 = std::array<bool,_16UL>::at(this_00,(long)*pvVar1);
  return (bool)(*pvVar2 & 1);
}

Assistant:

bool fp::Algorithm::IsExplored(std::array<int, 2> cur_node) {
    return this->explored_node_.at(cur_node.at(0)).at(cur_node.at(1));
}